

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

void slang::ast::ClassPropertySymbol::fromSyntax
               (Scope *scope,ClassPropertyDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::ClassPropertySymbol_*> *results)

{
  undefined8 uVar1;
  undefined8 uVar2;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar3;
  MemberSyntax *this;
  reference pTVar4;
  Scope *in_RDX;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  SourceRange SVar5;
  DiagCode unaff_retaddr;
  ClassPropertySymbol *var;
  DeclaratorSyntax *declarator;
  iterator __end2_2;
  iterator __begin2_2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2_2;
  Token mod;
  iterator __end2_1;
  iterator __begin2_1;
  TokenList *__range2_1;
  Token qual;
  iterator __end2;
  iterator __begin2;
  TokenList *__range2;
  RandMode randMode;
  Visibility visibility;
  VariableLifetime lifetime;
  bool isConst;
  DataDeclarationSyntax *dataSyntax;
  Compilation *comp;
  SourceLocation in_stack_fffffffffffffea8;
  SourceLocation SVar6;
  ValueSymbol *in_stack_fffffffffffffeb0;
  span<slang::parsing::Token,_18446744073709551615UL> *in_stack_fffffffffffffeb8;
  Compilation *__range;
  ClassPropertySymbol *in_stack_fffffffffffffec0;
  ClassPropertySymbol *in_stack_fffffffffffffec8;
  SourceLocation in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  short in_stack_fffffffffffffedc;
  short in_stack_fffffffffffffede;
  SourceLocation in_stack_fffffffffffffee0;
  SourceLocation in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  bitmask<slang::ast::DeclaredTypeFlags> in_stack_fffffffffffffef4;
  bitmask<slang::ast::VariableFlags> local_fa [9];
  SourceLocation local_e8;
  string_view local_e0;
  ClassPropertySymbol *local_d0;
  DeclaratorSyntax *local_c8;
  iterator local_c0;
  iterator local_b0;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *local_a0;
  undefined8 local_98;
  Info *pIStack_90;
  Token *local_80;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  local_78;
  TokenList *local_70;
  undefined8 local_68;
  Info *pIStack_60;
  Token *local_50;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  local_48;
  long local_40;
  RandMode local_38;
  undefined4 local_34;
  int local_30;
  byte local_29;
  DataDeclarationSyntax *local_28;
  Compilation *local_20;
  
  local_20 = Scope::getCompilation((Scope *)in_RDI);
  this = not_null<slang::syntax::MemberSyntax_*>::operator->
                   ((not_null<slang::syntax::MemberSyntax_*> *)0x41d008);
  local_28 = slang::syntax::SyntaxNode::as<slang::syntax::DataDeclarationSyntax>
                       (&this->super_SyntaxNode);
  local_29 = 0;
  local_30 = 0;
  local_34 = 0;
  local_38 = None;
  local_40 = (long)in_RSI + 0x50;
  local_48._M_current =
       (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::begin
                          ((span<slang::parsing::Token,_18446744073709551615UL> *)
                           in_stack_fffffffffffffea8);
  local_50 = (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::end
                                (in_stack_fffffffffffffeb8);
  uVar2._0_2_ = in_stack_fffffffffffffedc;
  while (bVar3 = __gnu_cxx::
                 operator==<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                           ((__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffeb0,
                            (__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffea8), ((bVar3 ^ 0xffU) & 1) != 0) {
    pTVar4 = __gnu_cxx::
             __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
             ::operator*(&local_48);
    uVar1._0_2_ = pTVar4->kind;
    uVar1._2_1_ = pTVar4->field_0x2;
    uVar1._3_1_ = pTVar4->numFlags;
    uVar1._4_4_ = pTVar4->rawLen;
    pIStack_60 = pTVar4->info;
    if ((short)uVar1 == 0x7d) {
      local_29 = 1;
    }
    else if ((short)uVar1 != 0xa7) {
      if ((short)uVar1 == 0xd1) {
        local_34 = 2;
      }
      else if ((short)uVar1 == 0xf1) {
        local_34 = 1;
      }
      else if ((short)uVar1 != 0xf8) {
        if ((short)uVar1 == 0xf9) {
          local_38 = Rand;
        }
        else if ((short)uVar1 == 0xfa) {
          local_38 = RandC;
        }
        else if ((short)uVar1 == 0x11c) {
          local_30 = 1;
        }
      }
    }
    local_68 = uVar1;
    __gnu_cxx::
    __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
    ::operator++(&local_48);
    in_stack_fffffffffffffede = (short)uVar1;
  }
  local_70 = &local_28->modifiers;
  local_78._M_current =
       (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::begin
                          ((span<slang::parsing::Token,_18446744073709551615UL> *)
                           in_stack_fffffffffffffea8);
  local_80 = (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::end
                                (in_stack_fffffffffffffeb8);
  while (bVar3 = __gnu_cxx::
                 operator==<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                           ((__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffeb0,
                            (__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffea8), ((bVar3 ^ 0xffU) & 1) != 0) {
    pTVar4 = __gnu_cxx::
             __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
             ::operator*(&local_78);
    uVar2._0_2_ = pTVar4->kind;
    uVar2._2_1_ = pTVar4->field_0x2;
    uVar2._3_1_ = pTVar4->numFlags;
    uVar2._4_4_ = pTVar4->rawLen;
    pIStack_90 = pTVar4->info;
    if ((short)uVar2 != 0x67) {
      if ((short)uVar2 == 0x7d) {
        local_29 = 1;
      }
      else if ((short)uVar2 == 0x11c) {
        local_30 = 1;
      }
    }
    local_98 = uVar2;
    __gnu_cxx::
    __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
    ::operator++(&local_78);
  }
  local_a0 = &local_28->declarators;
  local_b0 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
                       ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x41d2b8);
  local_c0 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end
                       ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)
                        in_stack_fffffffffffffeb0);
  while (bVar3 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
                           ((self_type *)in_stack_fffffffffffffeb0,
                            (iterator_base<slang::syntax::DeclaratorSyntax_*> *)
                            in_stack_fffffffffffffea8), ((bVar3 ^ 0xffU) & 1) != 0) {
    local_c8 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
               ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                            *)0x41d312);
    __range = local_20;
    local_e0 = parsing::Token::valueText((Token *)in_stack_fffffffffffffec0);
    local_e8 = parsing::Token::location(&local_c8->name);
    in_stack_fffffffffffffec0 =
         BumpAllocator::
         emplace<slang::ast::ClassPropertySymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime&,slang::ast::Visibility&>
                   ((BumpAllocator *)in_stack_fffffffffffffee0,
                    (basic_string_view<char,_std::char_traits<char>_> *)
                    CONCAT26(in_stack_fffffffffffffede,
                             CONCAT24((short)uVar2,in_stack_fffffffffffffed8)),
                    (SourceLocation *)in_stack_fffffffffffffed0,
                    (VariableLifetime *)in_stack_fffffffffffffec8,
                    (Visibility *)in_stack_fffffffffffffec0);
    in_stack_fffffffffffffec0->randMode = local_38;
    local_d0 = in_stack_fffffffffffffec0;
    not_null<slang::syntax::DataTypeSyntax_*>::operator*
              ((not_null<slang::syntax::DataTypeSyntax_*> *)0x41d3bd);
    ValueSymbol::setDeclaredType
              (in_stack_fffffffffffffeb0,(DataTypeSyntax *)in_stack_fffffffffffffea8);
    in_stack_fffffffffffffed0 = in_RDI;
    ValueSymbol::setFromDeclarator
              (in_stack_fffffffffffffeb0,(DeclaratorSyntax *)in_stack_fffffffffffffea8);
    in_stack_fffffffffffffec8 = local_d0;
    SVar6 = in_stack_fffffffffffffed0;
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               in_stack_fffffffffffffec0,
               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__range);
    syntax_00._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffef0;
    syntax_00._M_ptr = (pointer)in_stack_fffffffffffffee8;
    syntax_00._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffef4.m_bits;
    Symbol::setAttributes
              ((Symbol *)in_stack_fffffffffffffee0,
               (Scope *)CONCAT26(in_stack_fffffffffffffede,
                                 CONCAT24((short)uVar2,in_stack_fffffffffffffed8)),syntax_00);
    SmallVectorBase<const_slang::ast::ClassPropertySymbol_*>::push_back
              ((SmallVectorBase<const_slang::ast::ClassPropertySymbol_*> *)in_stack_fffffffffffffeb0
               ,(ClassPropertySymbol **)in_stack_fffffffffffffea8);
    if ((local_29 & 1) != 0) {
      bitmask<slang::ast::VariableFlags>::bitmask(local_fa,Const);
      bitmask<slang::ast::VariableFlags>::operator|=
                (&(local_d0->super_VariableSymbol).flags,local_fa);
    }
    if (local_38 != None) {
      ValueSymbol::getDeclaredType((ValueSymbol *)in_stack_fffffffffffffea8);
      in_stack_fffffffffffffeb0 =
           (ValueSymbol *)
           not_null<slang::ast::DeclaredType_*>::operator->
                     ((not_null<slang::ast::DeclaredType_*> *)0x41d495);
      bitmask<slang::ast::DeclaredTypeFlags>::bitmask
                ((bitmask<slang::ast::DeclaredTypeFlags> *)&stack0xfffffffffffffef4,Rand);
      DeclaredType::addFlags
                ((DeclaredType *)in_stack_fffffffffffffea8,
                 (bitmask<slang::ast::DeclaredTypeFlags>)
                 (underlying_type)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
    }
    in_RDI = SVar6;
    if ((((local_29 & 1) != 0) && (local_30 == 1)) &&
       (local_c8->initializer == (EqualsValueClauseSyntax *)0x0)) {
      in_stack_fffffffffffffef0 = 0xc20006;
      SVar5 = parsing::Token::range((Token *)in_stack_fffffffffffffed0);
      in_stack_fffffffffffffee0 = SVar5.startLoc;
      in_stack_fffffffffffffee8 = SVar5.endLoc;
      SVar5.endLoc = in_RDI;
      SVar5.startLoc = in_RSI;
      Scope::addDiag(in_RDX,unaff_retaddr,SVar5);
      in_stack_fffffffffffffea8 = SVar6;
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                *)in_stack_fffffffffffffeb0);
  }
  return;
}

Assistant:

void ClassPropertySymbol::fromSyntax(const Scope& scope,
                                     const ClassPropertyDeclarationSyntax& syntax,
                                     SmallVectorBase<const ClassPropertySymbol*>& results) {
    auto& comp = scope.getCompilation();
    auto& dataSyntax = syntax.declaration->as<DataDeclarationSyntax>();

    bool isConst = false;
    VariableLifetime lifetime = VariableLifetime::Automatic;
    Visibility visibility = Visibility::Public;
    RandMode randMode = RandMode::None;

    for (Token qual : syntax.qualifiers) {
        switch (qual.kind) {
            case TokenKind::ConstKeyword:
                isConst = true;
                break;
            case TokenKind::StaticKeyword:
                lifetime = VariableLifetime::Static;
                break;
            case TokenKind::LocalKeyword:
                visibility = Visibility::Local;
                break;
            case TokenKind::ProtectedKeyword:
                visibility = Visibility::Protected;
                break;
            case TokenKind::RandKeyword:
                randMode = RandMode::Rand;
                break;
            case TokenKind::RandCKeyword:
                randMode = RandMode::RandC;
                break;
            case TokenKind::PureKeyword:
            case TokenKind::VirtualKeyword:
            case TokenKind::ExternKeyword:
                // These are not allowed on properties; the parser will issue a diagnostic
                // so just ignore them here.
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    for (Token mod : dataSyntax.modifiers) {
        switch (mod.kind) {
            case TokenKind::VarKeyword:
            case TokenKind::AutomaticKeyword:
                break;
            case TokenKind::ConstKeyword:
                isConst = true;
                break;
            case TokenKind::StaticKeyword:
                lifetime = VariableLifetime::Static;
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    for (auto declarator : dataSyntax.declarators) {
        auto var = comp.emplace<ClassPropertySymbol>(declarator->name.valueText(),
                                                     declarator->name.location(), lifetime,
                                                     visibility);
        var->randMode = randMode;
        var->setDeclaredType(*dataSyntax.type);
        var->setFromDeclarator(*declarator);
        var->setAttributes(scope, syntax.attributes);
        results.push_back(var);

        if (isConst)
            var->flags |= VariableFlags::Const;

        if (randMode != RandMode::None)
            var->getDeclaredType()->addFlags(DeclaredTypeFlags::Rand);

        if (isConst && lifetime == VariableLifetime::Static && !declarator->initializer)
            scope.addDiag(diag::StaticConstNoInitializer, declarator->name.range());
    }
}